

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O1

int main(void)

{
  uint64_t *puVar1;
  uint *puVar2;
  bool bVar3;
  uint32_t *__ptr;
  uint uVar4;
  int iVar5;
  bitset_container_t *pbVar6;
  array_container_t *paVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  int32_t iVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  int i_1;
  int i;
  int iVar16;
  long lVar17;
  uint uVar18;
  float fVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  timespec ts;
  timespec local_60;
  bitset_container_t *local_50;
  uint32_t *local_48;
  ulong local_40;
  ulong local_38;
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar9 = (ulong)puVar2[3];
  uVar4 = *puVar2 >> 4;
  if (uVar4 < 0x406c) {
    if (uVar4 < 0x2065) {
      if (uVar4 < 0x266) {
        if (uVar4 < 0x6d) {
          uVar9 = (ulong)(uVar4 - 99);
          if (uVar4 - 99 < 2) {
            pcVar13 = "Prescott";
            goto LAB_00101fbc;
          }
          if (uVar4 == 0x66) {
            pcVar13 = "Presler";
            goto LAB_00101fbc;
          }
        }
        else {
          if (uVar4 == 0x6d) {
            pcVar13 = "Dothan";
            goto LAB_00101fbc;
          }
          if (uVar4 == 0x6f) goto switchD_00101d69_caseD_0;
          if (uVar4 == 0x16c) {
            pcVar13 = "Pineview";
            goto LAB_00101fbc;
          }
        }
      }
      else {
        uVar10 = (ulong)(uVar4 - 0x1066);
        if (uVar4 - 0x1066 < 9) {
          uVar9 = (long)&switchD_00101d69::switchdataD_0011105c +
                  (long)(int)(&switchD_00101d69::switchdataD_0011105c)[uVar10];
          switch(uVar10) {
          case 0:
switchD_00101d69_caseD_0:
            pcVar13 = "Merom";
            goto LAB_00101fbc;
          case 1:
          case 7:
            pcVar13 = "Penryn";
            goto LAB_00101fbc;
          case 4:
          case 8:
switchD_00101d69_caseD_4:
            pcVar13 = "Nehalem";
            goto LAB_00101fbc;
          }
        }
        else {
          uVar9 = uVar10;
          if (uVar4 == 0x266) {
            pcVar13 = "Lincroft";
            goto LAB_00101fbc;
          }
          if (uVar4 == 0x366) {
            pcVar13 = "Cedarview";
            goto LAB_00101fbc;
          }
        }
      }
    }
    else if (uVar4 < 0x306a) {
      uVar4 = uVar4 - 0x2065;
      if (uVar4 < 0xb) {
        uVar9 = 0x481;
        if ((0x481U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar13 = "Westmere";
          goto LAB_00101fbc;
        }
        uVar9 = 0x120;
        if ((0x120U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar13 = "SandyBridge";
          goto LAB_00101fbc;
        }
        if (uVar4 == 9) goto switchD_00101d69_caseD_4;
      }
    }
    else if (uVar4 < 0x306d) {
      if (uVar4 == 0x306a) {
        pcVar13 = "IvyBridge";
        goto LAB_00101fbc;
      }
      if (uVar4 == 0x306c) {
        pcVar13 = "Haswell";
        goto LAB_00101fbc;
      }
    }
    else {
      if (uVar4 == 0x306d) {
        pcVar13 = "Broadwell";
        goto LAB_00101fbc;
      }
      if (uVar4 == 0x30f1) goto LAB_00101f4f;
    }
  }
  else if (uVar4 < 0x9067) {
    if (uVar4 < 0x706a) {
      if (uVar4 < 0x606a) {
        if (uVar4 == 0x406c) {
          pcVar13 = "CherryTrail";
          goto LAB_00101fbc;
        }
        if (uVar4 == 0x506c) goto LAB_00101eef;
        if (uVar4 == 0x506e) {
          pcVar13 = "Skylake";
          goto LAB_00101fbc;
        }
      }
      else {
        if (uVar4 == 0x606a) {
LAB_00101efb:
          pcVar13 = "Icelake";
          goto LAB_00101fbc;
        }
        if ((uVar4 == 0x60f0) || (uVar4 == 0x60f8)) {
LAB_00101f4f:
          pcVar13 = "Zen2";
          goto LAB_00101fbc;
        }
      }
    }
    else if (uVar4 < 0x806c) {
      if (uVar4 == 0x706a) {
LAB_00101eef:
        pcVar13 = "Goldmont";
        goto LAB_00101fbc;
      }
      if (uVar4 == 0x706e) goto LAB_00101efb;
      if (uVar4 == 0x70f1) goto LAB_00101f4f;
    }
    else {
      uVar9 = (ulong)(uVar4 - 0x806c);
      if (uVar4 - 0x806c < 2) {
        pcVar13 = "TigerLake";
        goto LAB_00101fbc;
      }
      if (uVar4 == 0x806e) {
LAB_00101f5f:
        pcVar13 = "Kabylake";
        goto LAB_00101fbc;
      }
    }
  }
  else if (uVar4 < 0xa067) {
    if (uVar4 < 0x90f0) {
      if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
        pcVar13 = "Alderlake";
        goto LAB_00101fbc;
      }
      if (uVar4 == 0x906e) goto LAB_00101f5f;
    }
    else {
      uVar9 = (ulong)(uVar4 - 0xa065);
      if (uVar4 - 0xa065 < 2) {
        pcVar13 = "Cometlake";
        goto LAB_00101fbc;
      }
      if (uVar4 == 0x90f0) goto LAB_00101f4f;
    }
  }
  else if (uVar4 < 0x40f40) {
    if (uVar4 == 0xa067) {
      pcVar13 = "Rocketlake";
      goto LAB_00101fbc;
    }
    if (uVar4 == 0xb067) {
      pcVar13 = "Raptorlake";
      goto LAB_00101fbc;
    }
    if (uVar4 == 0x20f10) goto LAB_00101f07;
  }
  else {
    if (uVar4 == 0x40f40) {
      pcVar13 = "Zen3+";
      goto LAB_00101fbc;
    }
    if (uVar4 == 0x50f00) {
LAB_00101f07:
      pcVar13 = "Zen3";
      goto LAB_00101fbc;
    }
    if (uVar4 == 0x60f10) {
      pcVar13 = "Zen4";
      goto LAB_00101fbc;
    }
  }
  pcVar13 = "unknown";
LAB_00101fbc:
  iVar16 = 0;
  printf("x64 processor:  %s\t",pcVar13,(ulong)puVar2[2],uVar9);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar17 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar17 + 0xc) != '@') {
    lVar17 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar17 + 0xc),
           (ulong)*(uint *)(lVar17 + 8),(ulong)*(uint *)(lVar17 + 0xc));
  }
  puts("bitset container benchmarks");
  pbVar6 = bitset_container_create();
  printf("%s: ","set_test(B)");
  fflush((FILE *)0x0);
  uVar9 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_60);
    lVar17 = CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec);
    lVar12 = CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec);
    puVar1 = pbVar6->words;
    iVar5 = pbVar6->cardinality;
    uVar10 = 0xfffffffd;
    do {
      uVar4 = (int)uVar10 + 3;
      uVar10 = (ulong)uVar4;
      uVar15 = puVar1[uVar4 >> 6];
      uVar14 = uVar15 | 1L << (uVar10 & 0x3f);
      iVar5 = iVar5 + (int)((uVar15 ^ uVar14) >> ((byte)uVar4 & 0x3f));
      puVar1[uVar4 >> 6] = uVar14;
    } while (uVar4 < 0xfffd);
    pbVar6->cardinality = iVar5;
    clock_gettime(3,&local_60);
    uVar10 = (CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec) - lVar17) * 1000000000 +
             (CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec) - lVar12);
    if (uVar10 < uVar9) {
      uVar9 = uVar10;
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar9 / 21845.0));
  putchar(10);
  uVar4 = 0;
  fflush((FILE *)0x0);
  uVar18 = 0;
  iVar16 = 0;
  iVar5 = 0;
  do {
    uVar9 = pbVar6->words[uVar4 >> 6];
    auVar21._8_4_ = (int)uVar9;
    auVar21._0_8_ = uVar9;
    uVar9 = 1L << (ulong)(uVar18 & 0x3f) & uVar9;
    iVar25 = -(uint)((auVar21 & (undefined1  [12])0x1) == (undefined1  [12])0x0);
    auVar22._4_4_ = 0xffffffff;
    auVar22._0_4_ = -(uint)((int)(uVar9 >> 0x20) == 0);
    auVar22._8_4_ = 0xffffffff;
    auVar22._12_4_ = iVar25;
    auVar24._4_4_ = iVar25;
    auVar24._0_4_ = -(uint)((int)uVar9 == 0);
    auVar24._8_4_ = iVar25;
    auVar24._12_4_ = 0xffffffff;
    iVar16 = iVar16 + SUB164(auVar24 & auVar22,0) + 1;
    iVar5 = iVar5 + SUB164(auVar24 & auVar22,4) + 1;
    uVar4 = uVar4 + 2;
    uVar18 = uVar18 + 2;
  } while (uVar4 != 0x10000);
  local_48 = (uint32_t *)CONCAT44(local_48._4_4_,iVar5 + iVar16);
  bVar3 = false;
  local_50 = pbVar6;
  printf("%s: ","get_test(B)");
  fflush((FILE *)0x0);
  uVar9 = 0xffffffffffffffff;
  iVar16 = 0;
  do {
    clock_gettime(3,&local_60);
    lVar17 = CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec);
    lVar12 = CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec);
    uVar4 = 0;
    uVar18 = 0;
    iVar5 = 0;
    iVar25 = 0;
    do {
      uVar10 = local_50->words[uVar4 >> 6];
      auVar23._4_12_ = SUB1612((undefined1  [16])0x0,4);
      auVar23._0_4_ = uVar18 & 0x3f;
      auVar20._8_4_ = (int)uVar10;
      auVar20._0_8_ = uVar10;
      uVar10 = 1L << auVar23._0_8_ & uVar10;
      iVar5 = (iVar5 - (uint)((int)uVar10 == 0 && (int)(uVar10 >> 0x20) == 0)) + 1;
      iVar25 = (iVar25 - (uint)((auVar20 & (undefined1  [12])0x1) == (undefined1  [12])0x0)) + 1;
      uVar4 = uVar4 + 2;
      uVar18 = uVar18 + 2;
    } while (uVar4 != 0x10000);
    if (iVar25 + iVar5 != (int)local_48) {
      bVar3 = true;
    }
    clock_gettime(3,&local_60);
    uVar10 = (CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec) - lVar17) * 1000000000 +
             (CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec) - lVar12);
    if (uVar10 < uVar9) {
      uVar9 = uVar10;
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar9 * 1.5258789e-05));
  if (bVar3) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar3 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_cardinality(B)");
  fflush((FILE *)0x0);
  iVar16 = 500;
  uVar9 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_60);
    lVar17 = CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec);
    lVar12 = CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec);
    if (local_50->cardinality != (int)local_48) {
      bVar3 = true;
    }
    clock_gettime(3,&local_60);
    uVar10 = (CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec) - lVar17) * 1000000000 +
             (CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec) - lVar12);
    if (uVar9 <= uVar10) {
      uVar10 = uVar9;
    }
    iVar16 = iVar16 + -1;
    uVar9 = uVar10;
  } while (iVar16 != 0);
  printf(" %.2f cycles per operation",(double)uVar10);
  if (bVar3) {
    printf(" [ERROR]");
  }
  putchar(10);
  bVar3 = false;
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(B)");
  fflush((FILE *)0x0);
  iVar16 = 500;
  uVar9 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_60);
    lVar17 = CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec);
    lVar12 = CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec);
    iVar5 = bitset_container_compute_cardinality(local_50);
    if (iVar5 != (int)local_48) {
      bVar3 = true;
    }
    clock_gettime(3,&local_60);
    pbVar6 = local_50;
    uVar10 = (CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec) - lVar17) * 1000000000 +
             (CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec) - lVar12);
    if (uVar9 <= uVar10) {
      uVar10 = uVar9;
    }
    iVar16 = iVar16 + -1;
    uVar9 = uVar10;
  } while (iVar16 != 0);
  printf(" %.2f cycles per operation",(double)((float)uVar10 * 0.0009765625));
  if (bVar3) {
    printf(" [ERROR]");
  }
  putchar(10);
  iVar16 = 0;
  fflush((FILE *)0x0);
  printf("%s: ","unset_test(B)");
  fflush((FILE *)0x0);
  uVar9 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_60);
    lVar17 = CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec);
    lVar12 = CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec);
    puVar1 = pbVar6->words;
    iVar5 = pbVar6->cardinality;
    uVar10 = 0xfffffffd;
    do {
      uVar4 = (int)uVar10 + 3;
      uVar10 = (ulong)uVar4;
      uVar15 = puVar1[uVar4 >> 6];
      iVar5 = iVar5 - (uint)((uVar15 >> (uVar10 & 0x3f) & 1) != 0);
      puVar1[uVar4 >> 6] = uVar15 & ~(1L << (uVar10 & 0x3f));
    } while (uVar4 < 0xfffd);
    pbVar6->cardinality = iVar5;
    clock_gettime(3,&local_60);
    uVar10 = (CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec) - lVar17) * 1000000000 +
             (CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec) - lVar12);
    if (uVar10 < uVar9) {
      uVar9 = uVar10;
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar9 / 21845.0));
  putchar(10);
  fflush((FILE *)0x0);
  bitset_container_free(pbVar6);
  uVar9 = 0x1000;
  do {
    pbVar6 = bitset_container_create();
    iVar16 = pbVar6->cardinality;
    if (iVar16 < (int)uVar9) {
      puVar1 = pbVar6->words;
      do {
        uVar4 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
        bVar8 = (byte)(pcg32_global_0 >> 0x3b);
        uVar4 = uVar4 >> bVar8 | uVar4 << 0x20 - bVar8;
        uVar15 = (ulong)(uVar4 >> 3 & 0x1ff8);
        uVar10 = *(ulong *)((long)puVar1 + uVar15);
        uVar14 = uVar10 | 1L << ((ulong)uVar4 & 0x3f);
        pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        iVar16 = iVar16 + (int)((uVar10 ^ uVar14) >> ((byte)uVar4 & 0x3f));
        *(ulong *)((long)puVar1 + uVar15) = uVar14;
      } while (iVar16 < (int)uVar9);
      pbVar6->cardinality = iVar16;
    }
    bVar3 = false;
    local_38 = uVar9;
    printf("\n number of values in container = %d\n");
    local_50 = (bitset_container_t *)(ulong)(uint)pbVar6->cardinality;
    local_40 = (ulong)pbVar6->cardinality;
    local_48 = (uint32_t *)malloc((long)local_50 * 4 + 0x20);
    printf("%s: ","bitset_container_to_uint32_array(out, Bt, 1234)");
    fflush((FILE *)0x0);
    iVar16 = 500;
    uVar9 = 0xffffffffffffffff;
    do {
      clock_gettime(3,&local_60);
      lVar17 = CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec);
      lVar12 = CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec);
      iVar5 = bitset_container_to_uint32_array(local_48,pbVar6,0x4d2);
      if (iVar5 != (int)local_50) {
        bVar3 = true;
      }
      clock_gettime(3,&local_60);
      __ptr = local_48;
      uVar10 = (CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec) - lVar17) * 1000000000 +
               (CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec) - lVar12);
      if (uVar9 <= uVar10) {
        uVar10 = uVar9;
      }
      iVar16 = iVar16 + -1;
      uVar9 = uVar10;
    } while (iVar16 != 0);
    if ((long)local_40 < 0) {
      fVar19 = (float)((ulong)((uint)local_50 & 1) | local_40 >> 1);
      fVar19 = fVar19 + fVar19;
    }
    else {
      fVar19 = (float)(int)(uint)local_50;
    }
    printf(" %.2f cycles per operation",(double)((float)uVar10 / fVar19));
    if (bVar3) {
      printf(" [ERROR]");
    }
    putchar(10);
    lVar17 = 0;
    fflush((FILE *)0x0);
    free(__ptr);
    printf("%s %s: ","bitset_container_get","bitset_cache_prefetch");
    fflush((FILE *)0x0);
    iVar16 = 0;
    do {
      lVar12 = cpuid(0x80000006);
      uVar9 = 0;
      do {
        uVar9 = uVar9 + (*(uint *)(lVar12 + 0xc) >> 3 & 0x1f);
      } while (uVar9 < 0x400);
      clock_gettime(3,&local_60);
      iVar25 = (int)local_60.tv_nsec;
      iVar5 = (int)local_60.tv_sec;
      clock_gettime(3,&local_60);
      iVar16 = ((int)local_60.tv_sec - iVar5) * 1000000000 +
               iVar16 + ((int)local_60.tv_nsec - iVar25);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x400);
    printf(" %.2f cycles per operation",(double)((float)iVar16 * 0.0009765625));
    putchar(10);
    lVar17 = 0;
    fflush((FILE *)0x0);
    printf("%s %s: ","bitset_container_get","bitset_cache_flush");
    fflush((FILE *)0x0);
    iVar16 = 0;
    do {
      lVar12 = cpuid(0x80000006);
      uVar4 = *(uint *)(lVar12 + 0xc) >> 3 & 0x1f;
      lVar12 = 0;
      uVar9 = 0;
      do {
        clflush(*(undefined1 *)((long)pbVar6->words + lVar12));
        uVar9 = uVar9 + uVar4;
        lVar12 = lVar12 + (ulong)(uVar4 << 3);
      } while (uVar9 < 0x400);
      clock_gettime(3,&local_60);
      iVar25 = (int)local_60.tv_nsec;
      iVar5 = (int)local_60.tv_sec;
      clock_gettime(3,&local_60);
      iVar16 = ((int)local_60.tv_sec - iVar5) * 1000000000 +
               iVar16 + ((int)local_60.tv_nsec - iVar25);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x400);
    printf(" %.2f cycles per operation",(double)((float)iVar16 * 0.0009765625));
    putchar(10);
    fflush((FILE *)0x0);
    bitset_container_free(pbVar6);
    uVar9 = (ulong)((uint)local_38 * 2);
  } while ((uint)local_38 < 0x8001);
  putchar(10);
  benchmark_logical_operations();
  pbVar6 = bitset_container_create();
  puVar1 = pbVar6->words;
  iVar11 = pbVar6->cardinality;
  iVar16 = 0x1000;
  do {
    uVar4 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar8 = (byte)(pcg32_global_0 >> 0x3b);
    uVar4 = uVar4 >> bVar8 | uVar4 << 0x20 - bVar8;
    uVar10 = (ulong)(uVar4 >> 3 & 0x1ff8);
    uVar9 = *(ulong *)((long)puVar1 + uVar10);
    uVar15 = uVar9 | 1L << ((ulong)uVar4 & 0x3f);
    pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    iVar11 = iVar11 + (int)((uVar9 ^ uVar15) >> ((byte)uVar4 & 0x3f));
    *(ulong *)((long)puVar1 + uVar10) = uVar15;
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  pbVar6->cardinality = iVar11;
  paVar7 = array_container_from_bitset(pbVar6);
  local_48 = (uint32_t *)CONCAT44(local_48._4_4_,paVar7->cardinality);
  array_container_free(paVar7);
  bVar3 = false;
  printf("%s: ","get_cardinality_through_conversion_to_array(B1)");
  fflush((FILE *)0x0);
  iVar16 = 500;
  uVar9 = 0xffffffffffffffff;
  local_50 = pbVar6;
  do {
    clock_gettime(3,&local_60);
    lVar17 = CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec);
    lVar12 = CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec);
    paVar7 = array_container_from_bitset(local_50);
    iVar5 = paVar7->cardinality;
    array_container_free(paVar7);
    if (iVar5 != (int)local_48) {
      bVar3 = true;
    }
    clock_gettime(3,&local_60);
    pbVar6 = local_50;
    uVar10 = (CONCAT44(local_60.tv_sec._4_4_,(int)local_60.tv_sec) - lVar17) * 1000000000 +
             (CONCAT44(local_60.tv_nsec._4_4_,(int)local_60.tv_nsec) - lVar12);
    if (uVar9 <= uVar10) {
      uVar10 = uVar9;
    }
    iVar16 = iVar16 + -1;
    uVar9 = uVar10;
  } while (iVar16 != 0);
  printf(" %.2f cycles per operation",(double)((float)uVar10 * 0.0009765625));
  if (bVar3) {
    printf(" [ERROR]");
  }
  putchar(10);
  fflush((FILE *)0x0);
  bitset_container_free(pbVar6);
  return 0;
}

Assistant:

int main() {
    int size = (1 << 16) / 3;
    tellmeall();
    printf("bitset container benchmarks\n");
    bitset_container_t* B = bitset_container_create();
    BEST_TIME(set_test(B), 0, repeat, size);
    int answer = get_test(B);
    size = 1 << 16;
    BEST_TIME(get_test(B), answer, repeat, size);
    BEST_TIME(bitset_container_cardinality(B), answer, repeat, 1);
    BEST_TIME(bitset_container_compute_cardinality(B), answer, repeat,
              BITSET_CONTAINER_SIZE_IN_WORDS);

    size = (1 << 16) / 3;
    BEST_TIME(unset_test(B), 0, repeat, size);
    bitset_container_free(B);

    for (int howmany = 4096; howmany <= (1 << 16); howmany *= 2) {
        bitset_container_t* Bt = bitset_container_create();
        while (bitset_container_cardinality(Bt) < howmany) {
            bitset_container_set(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               bitset_container_cardinality(Bt));
        int card = bitset_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned)card + 32);
        BEST_TIME(bitset_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, bitset_container_get, bitset_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, bitset_container_get, bitset_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        bitset_container_free(Bt);
    }
    printf("\n");

    benchmark_logical_operations();

    // next we are going to benchmark conversion from bitset to array (an
    // important step)
    bitset_container_t* B1 = bitset_container_create();
    for (int k = 0; k < 4096; ++k) {
        bitset_container_set(B1, (uint16_t)ranged_random(1 << 16));
    }
    answer = get_cardinality_through_conversion_to_array(B1);
    BEST_TIME(get_cardinality_through_conversion_to_array(B1), answer, repeat,
              BITSET_CONTAINER_SIZE_IN_WORDS);

    bitset_container_free(B1);
    return 0;
}